

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

int stbir_set_pixel_subrect(STBIR_RESIZE *resize,int subx,int suby,int subw,int subh)

{
  double t1;
  double s1;
  double t0;
  double s0;
  int subh_local;
  int subw_local;
  int suby_local;
  int subx_local;
  STBIR_RESIZE *resize_local;
  
  resize->input_s0 = (double)subx / (double)resize->output_w;
  resize->input_t0 = (double)suby / (double)resize->output_h;
  resize->input_s1 = (double)(subx + subw) / (double)resize->output_w;
  resize->input_t1 = (double)(suby + subh) / (double)resize->output_h;
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;
  if ((((subx < resize->output_w) && (0 < subx + subw)) && (suby < resize->output_h)) &&
     (((0 < suby + subh && (subw != 0)) && (subh != 0)))) {
    resize_local._4_4_ = 1;
  }
  else {
    resize_local._4_4_ = 0;
  }
  return resize_local._4_4_;
}

Assistant:

STBIRDEF int stbir_set_pixel_subrect( STBIR_RESIZE * resize, int subx, int suby, int subw, int subh )                 // sets both regions (full regions by default)
{
  double s0, t0, s1, t1;

  s0 = ( (double)subx ) / ( (double)resize->output_w );
  t0 = ( (double)suby ) / ( (double)resize->output_h );
  s1 = ( (double)(subx+subw) ) / ( (double)resize->output_w );
  t1 = ( (double)(suby+subh) ) / ( (double)resize->output_h );

  resize->input_s0 = s0;
  resize->input_t0 = t0;
  resize->input_s1 = s1;
  resize->input_t1 = t1;
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;

  // are we inbounds?
  if ( ( subx >= resize->output_w ) || ( ( subx + subw ) <= 0 ) || ( suby >= resize->output_h ) || ( ( suby + subh ) <= 0 ) || ( subw == 0 ) || ( subh == 0 ) )
    return 0;

  return 1;
}